

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

void __thiscall soul::heart::ProcessorInstance::~ProcessorInstance(ProcessorInstance *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__ProcessorInstance_002da790;
  pcVar2 = (this->sourceName)._M_dataplus._M_p;
  paVar1 = &(this->sourceName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->instanceName)._M_dataplus._M_p;
  paVar1 = &(this->instanceName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  Object::~Object(&this->super_Object);
  operator_delete(this,0x90);
  return;
}

Assistant:

ProcessorInstance (CodeLocation l) : Object (std::move (l)) {}